

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkCopyOfExpression(CheckerVisitor *this,BinExpr *bin)

{
  bool bVar1;
  TreeOp TVar2;
  TreeOp TVar3;
  Node *pNVar4;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  BinExpr *binCmp;
  Expr *cmp;
  Expr *lhs;
  TreeOp op;
  Node *rhs;
  Node *lhs_00;
  BinExpr *local_28;
  
  if (((in_RDI->effectsOnly & 1U) == 0) &&
     (((TVar2 = Node::op((Node *)in_RSI), TVar2 == TO_OROR || (TVar2 == TO_ANDAND)) ||
      (TVar2 == TO_OR)))) {
    pNVar4 = &BinExpr::lhs(in_RSI)->super_Node;
    local_28 = (BinExpr *)BinExpr::rhs(in_RSI);
    while (TVar3 = Node::op((Node *)local_28), TVar3 == TVar2) {
      rhs = (Node *)&in_RDI->field_0x20;
      lhs_00 = pNVar4;
      BinExpr::lhs(local_28);
      bVar1 = NodeEqualChecker::check((NodeEqualChecker *)in_RDI,lhs_00,rhs);
      if (bVar1) {
LAB_0018ad5a:
        report(in_RDI,(Node *)local_28,0x52);
      }
      else {
        BinExpr::rhs(local_28);
        bVar1 = NodeEqualChecker::check((NodeEqualChecker *)in_RDI,lhs_00,rhs);
        if (bVar1) goto LAB_0018ad5a;
      }
      local_28 = (BinExpr *)BinExpr::rhs(local_28);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCopyOfExpression(const BinExpr *bin) {

  if (effectsOnly)
    return;

  enum TreeOp op = bin->op();
  if (op != TO_OROR && op != TO_ANDAND && op != TO_OR)
    return;

  const Expr *lhs = bin->lhs();
  const Expr *cmp = bin->rhs();

  while (cmp->op() == op) {
    const BinExpr *binCmp = static_cast<const BinExpr *>(cmp);

    if (_equalChecker.check(lhs, binCmp->lhs()) || _equalChecker.check(lhs, binCmp->rhs())) {
      report(binCmp, DiagnosticsId::DI_COPY_OF_EXPR);
    }
    cmp = binCmp->rhs();
  }
}